

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

QRectF * __thiscall QPainter::boundingRect(QPainter *this,QRectF *r,QString *text,QTextOption *o)

{
  bool bVar1;
  qsizetype qVar2;
  QString *in_RCX;
  QRectF *in_RDX;
  QRectF *in_RDI;
  qreal aleft;
  qreal atop;
  QPainterPrivate *d;
  QRectF *in_stack_000000c8;
  QString *in_stack_000000d0;
  QTextOption *in_stack_000000d8;
  int in_stack_000000e4;
  QRectF *in_stack_000000e8;
  QFont *in_stack_000000f0;
  int in_stack_00002c50;
  int *in_stack_00002c58;
  int in_stack_00002c60;
  QPainter *in_stack_00002c68;
  
  d_func((QPainter *)0x5a3075);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x5a308b);
  if ((bVar1) && (qVar2 = QString::size(in_RCX), qVar2 != 0)) {
    in_RDI->xp = -NAN;
    in_RDI->yp = -NAN;
    in_RDI->w = -NAN;
    in_RDI->h = -NAN;
    QRectF::QRectF(in_RDI);
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5a311c);
    qt_format_text(in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,
                   in_stack_000000d0,in_stack_000000c8,in_stack_00002c50,in_stack_00002c58,
                   in_stack_00002c60,in_stack_00002c68);
  }
  else {
    aleft = QRectF::x(in_RDX);
    atop = QRectF::y(in_RDX);
    QRectF::QRectF(in_RDI,aleft,atop,0.0,0.0);
  }
  return in_RDI;
}

Assistant:

QRectF QPainter::boundingRect(const QRectF &r, const QString &text, const QTextOption &o)
{
    Q_D(QPainter);

    if (!d->engine || text.size() == 0)
        return QRectF(r.x(),r.y(), 0,0);

    QRectF br;
    qt_format_text(d->state->font, r, Qt::TextDontPrint, &o, text, &br, 0, nullptr, 0, this);
    return br;
}